

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  cmTarget *pcVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  int iVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  ostream *poVar6;
  cmake *pcVar7;
  cmListFileBacktrace *r;
  _Rb_tree_node_base *p_Var8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  cmGeneratorTarget *pcVar10;
  pointer ppVar11;
  PolicyID id;
  pointer item;
  cmTargetLinkLibraryType cVar12;
  MessageType t;
  cmCompiledGeneratorExpression *pcVar13;
  pointer item_00;
  bool bVar14;
  cmStringRange cVar15;
  cmBacktraceRange cVar16;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  string evaluated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmGeneratorExpressionDAGChecker dagChecker;
  ostringstream e;
  const_iterator local_360;
  auto_ptr<cmCompiledGeneratorExpression> local_358;
  undefined4 local_34c;
  cmOptionalLinkImplementation *local_348;
  string local_340;
  cmListFileBacktrace *local_320;
  string local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  string local_2e0;
  string local_2c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2a0;
  string *local_298;
  const_iterator local_290;
  cmGeneratorTarget *local_288;
  PolicyMap *local_280;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_278;
  undefined1 local_270 [16];
  undefined1 local_260 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_228;
  cmListFileBacktrace local_1f0;
  undefined1 local_1c8 [32];
  cmGeneratorTarget *local_1a8;
  cmListFileBacktrace local_1a0 [2];
  ios_base local_158 [264];
  cmListFileBacktrace local_50;
  
  local_348 = impl;
  local_288 = head;
  cVar15 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  cVar16 = cmTarget::GetLinkImplementationBacktraces(this->Target);
  local_320 = (cmListFileBacktrace *)cVar16.Begin._M_current;
  local_290._M_current = cVar15.End._M_current._M_current;
  if (cVar15.Begin._M_current._M_current != cVar15.End._M_current._M_current) {
    local_280 = &this->PolicyMap;
    local_278 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->LinkImplicitNullProperties;
    local_2a0 = &this->MaxLanguageStandards;
    local_298 = config;
    do {
      local_290 = cVar15.End._M_current;
      local_360 = cVar15.Begin._M_current;
      pcVar13 = (cmCompiledGeneratorExpression *)(local_1c8 + 0x10);
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8._24_6_ = 0x534549524152;
      local_1c8[0x10] = 'L';
      local_1c8._17_5_ = 0x4c5f4b4e49;
      local_1c8._22_2_ = 0x4249;
      local_1c8._8_8_ = 0xe;
      local_1c8[0x1e] = '\0';
      local_1c8._0_8_ = pcVar13;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_270,&this->Target->Name,
                 (string *)local_1c8,(GeneratorExpressionContent *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      if ((cmCompiledGeneratorExpression *)local_1c8._0_8_ != pcVar13) {
        operator_delete((void *)local_1c8._0_8_,
                        CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10])) + 1);
      }
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&local_2c0,local_320);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1c8,&local_2c0);
      local_358.x_ = (cmCompiledGeneratorExpression *)local_1c8._0_8_;
      local_1c8._0_8_ = (pointer)0x0;
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_1c8);
      local_1c8._8_8_ = 0;
      local_1c8[0x10] = '\0';
      local_1c8._0_8_ = pcVar13;
      pcVar5 = cmCompiledGeneratorExpression::Evaluate
                         (local_358.x_,this->LocalGenerator,config,false,local_288,
                          (cmGeneratorExpressionDAGChecker *)local_270,(string *)local_1c8);
      std::__cxx11::string::string((string *)&local_2e0,pcVar5,(allocator *)&local_318);
      if ((cmCompiledGeneratorExpression *)local_1c8._0_8_ != pcVar13) {
        operator_delete((void *)local_1c8._0_8_,
                        CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10])) + 1);
      }
      cmSystemTools::ExpandListArgument(&local_2e0,&local_2f8,false);
      if ((local_358.x_)->HadHeadSensitiveCondition == true) {
        local_348->HadHeadSensitiveCondition = true;
      }
      item_00 = local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          CheckCMP0004(&local_318,this,item_00);
          if (local_318._M_string_length == (this->Target->Name)._M_string_length) {
            if ((local_318._M_string_length == 0) ||
               (iVar3 = bcmp(local_318._M_dataplus._M_p,(this->Target->Name)._M_dataplus._M_p,
                             local_318._M_string_length), iVar3 == 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              PVar4 = cmPolicies::PolicyMap::Get(local_280,CMP0038);
              if (PVar4 == OLD) {
LAB_0039fb5a:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                std::ios_base::~ios_base(local_158);
                goto LAB_0039fb76;
              }
              if (PVar4 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_340,(cmPolicies *)0x26,id);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1c8,local_340._M_dataplus._M_p,
                                    local_340._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p,
                                  local_340.field_2._M_allocated_capacity + 1);
                }
                local_34c = 0;
                t = AUTHOR_WARNING;
              }
              else {
                t = FATAL_ERROR;
                local_34c = (undefined4)CONCAT71((uint7)(uint3)(PVar4 >> 8),1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Target \"",8)
              ;
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1c8,(this->Target->Name)._M_dataplus._M_p,
                                  (this->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" links to itself.",0x12);
              pcVar7 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
              std::__cxx11::stringbuf::str();
              r = cmTarget::GetBacktrace(this->Target);
              cmListFileBacktrace::cmListFileBacktrace(&local_50,r);
              cmake::IssueMessage(pcVar7,t,&local_340,&local_50);
              cmListFileBacktrace::~cmListFileBacktrace(&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_dataplus._M_p != &local_340.field_2) {
                operator_delete(local_340._M_dataplus._M_p,
                                local_340.field_2._M_allocated_capacity + 1);
              }
              if ((char)local_34c == '\0') goto LAB_0039fb5a;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
              std::ios_base::~ios_base(local_158);
              iVar3 = 1;
              goto LAB_0039fb7b;
            }
LAB_0039fa1c:
            pcVar10 = FindTargetToLink(this,&local_318);
            bVar14 = true;
            if (local_2e0._M_string_length == (local_360._M_current)->_M_string_length) {
              if (local_2e0._M_string_length == 0) {
                bVar14 = false;
              }
              else {
                iVar3 = bcmp(local_2e0._M_dataplus._M_p,((local_360._M_current)->_M_dataplus)._M_p,
                             local_2e0._M_string_length);
                bVar14 = iVar3 != 0;
              }
            }
            cmLinkImplItem::cmLinkImplItem
                      ((cmLinkImplItem *)local_1c8,&local_318,pcVar10,local_320,bVar14);
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
            emplace_back<cmLinkImplItem>
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_348,
                       (cmLinkImplItem *)local_1c8);
            cmListFileBacktrace::~cmListFileBacktrace(local_1a0);
            if ((cmCompiledGeneratorExpression *)local_1c8._0_8_ !=
                (cmCompiledGeneratorExpression *)(local_1c8 + 0x10)) {
              operator_delete((void *)local_1c8._0_8_,
                              CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10]))
                              + 1);
            }
            iVar3 = 0;
            bVar14 = true;
          }
          else {
            if (local_318._M_string_length != 0) goto LAB_0039fa1c;
LAB_0039fb76:
            iVar3 = 7;
LAB_0039fb7b:
            bVar14 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_0039fc87;
          item_00 = item_00 + 1;
        } while (item_00 !=
                 local_2f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      psVar2 = &(local_358.x_)->SeenTargetProperties;
      for (p_Var8 = ((local_358.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        pcVar5 = GetProperty(this,(string *)(p_Var8 + 1));
        if (pcVar5 == (char *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var8 + 1));
        }
      }
      bVar14 = true;
      cmCompiledGeneratorExpression::GetMaxLanguageStandard(local_358.x_,this,local_2a0);
LAB_0039fc87:
      config = local_298;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_358);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_2c0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1f0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_allocated_capacity != &local_238) {
        operator_delete((void *)local_248._M_allocated_capacity,local_238._M_allocated_capacity + 1)
        ;
      }
      if ((undefined1 *)local_270._8_8_ != local_260 + 8) {
        operator_delete((void *)local_270._8_8_,local_260._8_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2f8);
      if (!bVar14) {
        return;
      }
      local_320 = local_320 + 1;
      cVar15.End._M_current = local_290._M_current;
      cVar15.Begin._M_current = local_360._M_current + 1;
    } while (local_360._M_current + 1 != local_290._M_current);
  }
  pcVar7 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2c0,pcVar7);
  if (config->_M_string_length == 0) {
    cVar12 = OPTIMIZED_LibraryType;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_1c8,config);
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (local_2c0._M_dataplus._M_p,local_2c0._M_string_length,local_1c8);
    if ((cmCompiledGeneratorExpression *)local_1c8._0_8_ !=
        (cmCompiledGeneratorExpression *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,
                      CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10])) + 1);
    }
    cVar12 = (_Var9._M_current ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2c0._M_string_length) + DEBUG_LibraryType;
  }
  pcVar1 = this->Target;
  item = (pcVar1->OriginalLinkLibraries).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  ppVar11 = (pcVar1->OriginalLinkLibraries).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (item != ppVar11) {
    local_348 = (cmOptionalLinkImplementation *)
                &(local_348->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                 WrongConfigLibraries;
    do {
      if ((item->second != GENERAL_LibraryType) && (item->second != cVar12)) {
        CheckCMP0004((string *)local_270,this,&item->first);
        if ((pointer)local_270._8_8_ == (pointer)(this->Target->Name)._M_string_length) {
          if (((pointer)local_270._8_8_ != (pointer)0x0) &&
             (iVar3 = bcmp((void *)local_270._0_8_,(this->Target->Name)._M_dataplus._M_p,
                           local_270._8_8_), iVar3 != 0)) {
LAB_0039fe7d:
            pcVar10 = FindTargetToLink(this,(string *)local_270);
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1c8,local_270._0_8_,
                       (pointer)(local_270._8_8_ + local_270._0_8_));
            local_1a8 = pcVar10;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_348,
                       (cmLinkItem *)local_1c8);
            if ((cmCompiledGeneratorExpression *)local_1c8._0_8_ !=
                (cmCompiledGeneratorExpression *)(local_1c8 + 0x10)) {
              operator_delete((void *)local_1c8._0_8_,
                              CONCAT26(local_1c8._22_2_,CONCAT51(local_1c8._17_5_,local_1c8[0x10]))
                              + 1);
            }
          }
        }
        else if ((pointer)local_270._8_8_ != (pointer)0x0) goto LAB_0039fe7d;
        if ((cmGeneratorExpressionDAGChecker *)local_270._0_8_ !=
            (cmGeneratorExpressionDAGChecker *)local_260) {
          operator_delete((void *)local_270._0_8_,local_260._0_8_ + 1);
        }
        ppVar11 = (pcVar1->OriginalLinkLibraries).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      item = item + 1;
    } while (item != ppVar11);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange = this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange = this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
                                     end = entryRange.end();
       le != end; ++le, ++btIt) {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
      this->GetName(), "LINK_LIBRARIES", CM_NULLPTR, CM_NULLPTR);
    cmGeneratorExpression ge(*btIt);
    CM_AUTO_PTR<cmCompiledGeneratorExpression> const cge = ge.Parse(*le);
    std::string const evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }

    for (std::vector<std::string>::const_iterator li = llibs.begin();
         li != llibs.end(); ++li) {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(*li);
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(cmLinkImplItem(
        name, this->FindTargetToLink(name), *btIt, evaluated != *le));
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
         it != seenProps.end(); ++it) {
      if (!this->GetProperty(*it)) {
        this->LinkImplicitNullProperties.insert(*it);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
       li != oldllibs.end(); ++li) {
    if (li->second != GENERAL_LibraryType && li->second != linkType) {
      std::string name = this->CheckCMP0004(li->first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, this->FindTargetToLink(name)));
    }
  }
}